

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_context.c
# Opt level: O0

context context_create(char *name)

{
  context __ptr;
  size_t sVar1;
  char *pcVar2;
  scope psVar3;
  char *in_RDI;
  size_t name_size;
  context ctx;
  char *in_stack_fffffffffffffff8;
  
  if ((in_RDI == (char *)0x0) || (__ptr = (context)malloc(0x10), __ptr == (context)0x0)) {
    __ptr = (context)0x0;
  }
  else {
    sVar1 = strlen(in_RDI);
    pcVar2 = (char *)malloc(sVar1 + 1);
    __ptr->name = pcVar2;
    if (__ptr->name == (char *)0x0) {
      free(__ptr);
      __ptr = (context)0x0;
    }
    else {
      memcpy(__ptr->name,in_RDI,sVar1 + 1);
      psVar3 = scope_create(in_stack_fffffffffffffff8);
      __ptr->sp = psVar3;
    }
  }
  return __ptr;
}

Assistant:

context context_create(const char *name)
{
	if (name != NULL)
	{
		context ctx = malloc(sizeof(struct context_type));

		if (ctx != NULL)
		{
			size_t name_size = strlen(name) + 1;

			ctx->name = malloc(sizeof(char) * name_size);

			if (ctx->name == NULL)
			{
				/* error */

				free(ctx);

				return NULL;
			}

			memcpy(ctx->name, name, name_size);

			ctx->sp = scope_create("global_namespace");

			return ctx;
		}
	}

	return NULL;
}